

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall find_ctx::~find_ctx(find_ctx *this)

{
  void *__ptr;
  long *in_RDI;
  find_entry_page *cur;
  
  while (*in_RDI != 0) {
    __ptr = (void *)*in_RDI;
    *in_RDI = *(long *)*in_RDI;
    free(__ptr);
  }
  return;
}

Assistant:

~find_ctx()
    {
        /* free our list of results pages */
        while (results_head != 0)
        {
            /* remember the current page */
            find_entry_page *cur = results_head;

            /* move on to the next page */
            results_head = results_head->nxt;

            /* delete the current page */
            t3free(cur);
        }
    }